

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleTimeZone::setStartRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfWeekInMonth,int32_t dayOfWeek,
          int32_t time,TimeMode mode,UErrorCode *status)

{
  TimeMode mode_local;
  int32_t time_local;
  int32_t dayOfWeek_local;
  int32_t dayOfWeekInMonth_local;
  int32_t month_local;
  SimpleTimeZone *this_local;
  
  this->startMonth = (int8_t)month;
  this->startDay = (int8_t)dayOfWeekInMonth;
  this->startDayOfWeek = (int8_t)dayOfWeek;
  this->startTime = time;
  this->startTimeMode = mode;
  decodeStartRule(this,status);
  this->transitionRulesInitialized = '\0';
  return;
}

Assistant:

void
SimpleTimeZone::setStartRule(int32_t month, int32_t dayOfWeekInMonth, int32_t dayOfWeek,
                             int32_t time, TimeMode mode, UErrorCode& status)
{
    startMonth     = (int8_t)month;
    startDay       = (int8_t)dayOfWeekInMonth;
    startDayOfWeek = (int8_t)dayOfWeek;
    startTime      = time;
    startTimeMode  = mode;
    decodeStartRule(status);
    transitionRulesInitialized = FALSE;
}